

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O0

DotInterpretation units::findDotInterpretation(string *unit_string)

{
  bool bVar1;
  char *pcVar2;
  long lVar3;
  ulong uVar4;
  DotInterpretation local_21;
  long lStack_20;
  DotInterpretation dInt;
  size_type dloc;
  string *unit_string_local;
  
  lStack_20 = std::__cxx11::string::find_first_of((char)unit_string,0x2e);
  if (lStack_20 == -1) {
    unit_string_local._7_1_ = none;
  }
  else {
    local_21 = none;
    while (lStack_20 != -1) {
      if (lStack_20 == 0) {
        uVar4 = std::__cxx11::string::size();
        if (1 < uVar4) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          bVar1 = isDigitCharacter(*pcVar2);
          if (!bVar1) {
            local_21 = multiply;
          }
        }
      }
      else {
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        bVar1 = isDigitCharacter(*pcVar2);
        if (bVar1) {
          pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
          bVar1 = isDigitCharacter(*pcVar2);
          if (bVar1) goto LAB_001a4f64;
        }
        pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string);
        if ((*pcVar2 == '*') ||
           (pcVar2 = (char *)std::__cxx11::string::operator[]((ulong)unit_string), *pcVar2 == ' '))
        {
          return abbrev;
        }
        lVar3 = std::__cxx11::string::size();
        if (lStack_20 == lVar3 + -1) {
          return abbrev;
        }
        local_21 = multiply;
      }
LAB_001a4f64:
      lStack_20 = std::__cxx11::string::find_first_of((char)unit_string,0x2e);
    }
    unit_string_local._7_1_ = local_21;
  }
  return unit_string_local._7_1_;
}

Assistant:

static DotInterpretation findDotInterpretation(const std::string& unit_string)
{
    auto dloc = unit_string.find_first_of('.');
    if (dloc == std::string::npos) {
        // LCOV_EXCL_START
        // in all internal contexts this function wouldn't be called if there
        // was no dots
        return DotInterpretation::none;
        // LCOV_EXCL_STOP
    }
    DotInterpretation dInt{DotInterpretation::none};
    while (dloc != std::string::npos) {
        if (dloc > 0) {
            if (!isDigitCharacter(unit_string[dloc - 1]) ||
                !isDigitCharacter(unit_string[dloc + 1])) {
                if (unit_string[dloc - 1] == '*' ||
                    unit_string[dloc + 1] == ' ') {
                    return DotInterpretation::abbrev;
                }
                if (dloc == unit_string.size() - 1) {
                    return DotInterpretation::abbrev;
                }
                dInt = DotInterpretation::multiply;
            }
        } else if (unit_string.size() > 1) {
            if (!isDigitCharacter(unit_string[dloc + 1])) {
                dInt = DotInterpretation::multiply;
            }
        }
        dloc = unit_string.find_first_of('.', dloc + 1);
    }
    return dInt;
}